

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall
Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  size_t len;
  bool bVar3;
  Token token;
  undefined1 local_68 [32];
  Token local_48;
  
  bVar3 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar3);
  this->current_ = beginDoc;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
             0x11a3cc);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (&this->errors_);
  while (ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur,
        ppVVar2 !=
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_68._0_8_ = root;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_68);
  }
  else {
    *ppVVar2 = root;
    piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  bVar3 = readValue(this);
  skipCommentTokens(this,&local_48);
  if ((this->collectComments_ == true) && (len = (this->commentsBefore_)._M_string_length, len != 0)
     ) {
    Value::setComment(root,(this->commentsBefore_)._M_dataplus._M_p,len,commentAfter);
  }
  if (((this->features_).strictRoot_ == true) && ((*(ushort *)&root->field_0x8 & 0xfe) != 6)) {
    local_48.type_ = tokenError;
    local_68._0_8_ = (Value *)(local_68 + 0x10);
    local_48.start_ = beginDoc;
    local_48.end_ = endDoc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "A valid JSON document must be either an array or an object value.","");
    addError(this,(string *)local_68,&local_48,(Location)0x0);
    if ((Value *)local_68._0_8_ != (Value *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Reader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_ = "";
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}